

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinePositionSpan.cpp
# Opt level: O0

bool psy::operator==(LinePositionSpan *a,LinePositionSpan *b)

{
  bool bVar1;
  bool local_39;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  LinePositionSpan *local_18;
  LinePositionSpan *b_local;
  LinePositionSpan *a_local;
  
  local_18 = b;
  b_local = a;
  local_20 = LinePositionSpan::start(a);
  local_28 = LinePositionSpan::start(local_18);
  bVar1 = operator==((LinePosition *)&local_20,(LinePosition *)&local_28);
  local_39 = false;
  if (bVar1) {
    local_30 = LinePositionSpan::end(b_local);
    local_38 = LinePositionSpan::end(local_18);
    local_39 = operator==((LinePosition *)&local_30,(LinePosition *)&local_38);
  }
  return local_39;
}

Assistant:

bool operator==(const LinePositionSpan& a, const LinePositionSpan& b)
{
    return a.start() == b.start() && a.end() == b.end();
}